

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall cmGeneratorTarget::IsChrpathUsed(cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TargetType TVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  LinkClosure *pLVar7;
  char *pcVar8;
  bool bVar9;
  string ll;
  string sepVar;
  string local_88;
  string local_68;
  string local_48;
  
  TVar2 = this->Target->TargetTypeValue;
  if (MODULE_LIBRARY < TVar2) {
    return false;
  }
  if (TVar2 == STATIC_LIBRARY) {
    return false;
  }
  if (this->Target->HaveInstallRule != true) {
    return false;
  }
  pcVar3 = this->Makefile;
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CMAKE_SKIP_RPATH","");
  bVar5 = cmMakefile::IsOn(pcVar3,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    return false;
  }
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"BUILD_WITH_INSTALL_RPATH","")
  ;
  bVar5 = cmTarget::GetPropertyAsBool(this->Target,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    return false;
  }
  pcVar3 = this->Makefile;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CMAKE_NO_BUILTIN_CHRPATH","")
  ;
  bVar5 = cmMakefile::IsOn(pcVar3,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    return false;
  }
  pcVar3 = this->Makefile;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"CMAKE_PLATFORM_HAS_INSTALLNAME","");
  bVar5 = cmMakefile::IsOn(pcVar3,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  bVar9 = true;
  if (bVar5) {
    return true;
  }
  pLVar7 = GetLinkClosure(this,config);
  pcVar4 = (pLVar7->LinkerLanguage)._M_dataplus._M_p;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar4,pcVar4 + (pLVar7->LinkerLanguage)._M_string_length);
  if (local_88._M_string_length != 0) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"CMAKE_SHARED_LIBRARY_RUNTIME_","");
    std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_68);
    pcVar8 = cmMakefile::GetDefinition(this->Makefile,&local_68);
    bVar5 = true;
    if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
      pcVar3 = this->Makefile;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"CMAKE_EXECUTABLE_FORMAT","");
      pcVar8 = cmMakefile::GetDefinition(pcVar3,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      bVar5 = pcVar8 == (char *)0x0;
      if (!bVar5) {
        iVar6 = strcmp(pcVar8,"ELF");
        bVar9 = iVar6 == 0;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (!bVar5) goto LAB_0038a85e;
  }
  bVar9 = false;
LAB_0038a85e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    return bVar9;
  }
  return bVar9;
}

Assistant:

cmStateEnums::TargetType cmGeneratorTarget::GetType() const
{
  return this->Target->GetType();
}